

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O2

void __thiscall QTlsPrivate::TlsCryptographOpenSSL::destroySslContext(TlsCryptographOpenSSL *this)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->ssl != (SSL *)0x0) {
    iVar1 = q_SSL_in_init(this->ssl);
    if ((iVar1 == 0) && (this->systemOrSslErrorDetected == false)) {
      iVar1 = q_SSL_shutdown(this->ssl);
      if (iVar1 != 1) {
        local_38.size = -0x5555555555555556;
        local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_38.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        QTlsBackendOpenSSL::getErrorsFromOpenSsl();
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      }
    }
    q_SSL_free(this->ssl);
    this->ssl = (SSL *)0x0;
  }
  std::__shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->sslContextPointer).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::destroySslContext()
{
    if (ssl) {
        if (!q_SSL_in_init(ssl) && !systemOrSslErrorDetected) {
            // We do not send a shutdown alert here. Just mark the session as
            // resumable for qhttpnetworkconnection's "optimization", otherwise
            // OpenSSL won't start a session resumption.
            if (q_SSL_shutdown(ssl) != 1) {
                // Some error may be queued, clear it.
                const auto errors = QTlsBackendOpenSSL::getErrorsFromOpenSsl();
                Q_UNUSED(errors);
            }
        }
        q_SSL_free(ssl);
        ssl = nullptr;
    }
    sslContextPointer.reset();
}